

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O2

void slang::ast::Lookup::selectChild
               (Type *virtualInterface,SourceRange range,
               span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
               selectors,ASTContext *context,LookupResult *result)

{
  variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector> *__v
  ;
  Compilation *dst;
  long lVar1;
  size_t sVar2;
  char *pcVar3;
  SourceLocation SVar4;
  span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> nameParts_00;
  size_type sVar5;
  int iVar6;
  variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
  *pvVar7;
  undefined4 extraout_var;
  pointer pNVar8;
  variant_alternative_t<0UL,_variant<const_ElementSelectSyntax_*,_MemberSelector>_> *args;
  Symbol *pSVar9;
  long lVar10;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX;
  pointer pNVar11;
  ulong uVar12;
  SourceLocation ctx;
  SourceLocation SVar13;
  EVP_PKEY_CTX *ctx_00;
  pointer pNVar14;
  __extent_storage<18446744073709551615UL> _Var15;
  SourceLocation SVar16;
  SourceLocation SVar17;
  byte bVar18;
  SourceRange range_00;
  NameComponents unused;
  SmallVector<const_slang::syntax::ElementSelectSyntax_*,_5UL> elementSelects;
  SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> nameParts;
  
  _Var15 = selectors._M_extent._M_extent_value;
  bVar18 = 0;
  nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.data_ =
       (pointer)nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.
                firstElement;
  nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len = 0;
  elementSelects.super_SmallVectorBase<const_slang::syntax::ElementSelectSyntax_*>.data_ =
       (pointer)elementSelects.super_SmallVectorBase<const_slang::syntax::ElementSelectSyntax_*>.
                firstElement;
  elementSelects.super_SmallVectorBase<const_slang::syntax::ElementSelectSyntax_*>.len = 0;
  nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.cap = 4;
  elementSelects.super_SmallVectorBase<const_slang::syntax::ElementSelectSyntax_*>.cap = 5;
  dst = ((context->scope).ptr)->compilation;
  lVar1 = 9;
  pvVar7 = selectors._M_ptr + _Var15._M_extent_value;
  do {
    while( true ) {
      if (pvVar7 == selectors._M_ptr) {
        range_00.endLoc = (SourceLocation)_Var15._M_extent_value;
        range_00.startLoc = range.endLoc;
        pSVar9 = anon_unknown_39::getVirtualInterfaceTarget
                           ((anon_unknown_39 *)virtualInterface,(Type *)context,
                            (ASTContext *)range.startLoc,range_00);
        result->found = pSVar9;
        nameParts_00._M_extent._M_extent_value =
             nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len;
        nameParts_00._M_ptr =
             nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.data_;
        ctx_00 = (EVP_PKEY_CTX *)
                 nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len
        ;
        anon_unknown_39::lookupDownward
                  (nameParts_00,(NameComponents)ZEXT1656(ZEXT816(0)),context,
                   (bitmask<slang::ast::LookupFlags>)0x0,result);
        SmallVectorBase<const_slang::syntax::ElementSelectSyntax_*>::cleanup
                  (&elementSelects.super_SmallVectorBase<const_slang::syntax::ElementSelectSyntax_*>
                   ,ctx_00);
        SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>::cleanup
                  (&nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>,
                   ctx_00);
        return;
      }
      __v = pvVar7 + -1;
      if (pvVar7[-1].
          super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
          .
          super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
          .
          super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
          .
          super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
          .
          super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
          .
          super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
          ._M_index == '\x01') break;
      args = std::
             get<0ul,slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>
                       (__v);
      SmallVectorBase<slang::syntax::ElementSelectSyntax_const*>::
      emplace_back<slang::syntax::ElementSelectSyntax_const*const&>
                ((SmallVectorBase<slang::syntax::ElementSelectSyntax_const*> *)&elementSelects,args)
      ;
      pvVar7 = __v;
    }
    SVar16 = *(SourceLocation *)
              ((long)&pvVar7[-1].
                      super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                      .
                      super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                      .
                      super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                      .
                      super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                      .
                      super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                      .
                      super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                      ._M_u + 0x10);
    sVar2 = *(size_t *)
             &(__v->
              super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
              ).
              super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
              .
              super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
              .
              super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
              .
              super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
              .
              super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
              ._M_u;
    pcVar3 = *(char **)((long)&pvVar7[-1].
                               super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                               .
                               super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                               .
                               super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                               .
                               super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                               .
                               super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                               .
                               super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                               ._M_u + 8);
    SVar13 = *(SourceLocation *)
              ((long)&pvVar7[-1].
                      super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                      .
                      super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                      .
                      super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                      .
                      super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                      .
                      super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                      .
                      super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                      ._M_u + 0x18);
    SVar4 = *(SourceLocation *)
             ((long)&pvVar7[-1].
                     super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                     .
                     super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                     .
                     super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                     .
                     super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                     .
                     super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                     .
                     super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                     ._M_u + 0x20);
    std::ranges::__reverse_fn::
    operator()<slang::SmallVector<const_slang::syntax::ElementSelectSyntax_*,_5UL>_&>
              ((__reverse_fn *)&std::ranges::reverse,&elementSelects);
    iVar6 = SmallVectorBase<const_slang::syntax::ElementSelectSyntax_*>::copy
                      (&elementSelects.
                        super_SmallVectorBase<const_slang::syntax::ElementSelectSyntax_*>,
                       (EVP_PKEY_CTX *)dst,src);
    sVar5 = nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len;
    SVar17 = (SourceLocation)
             (nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.data_
             + nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len);
    ctx = (SourceLocation)0x1c71c71c71c71c7;
    if (nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len ==
        nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.cap) {
      if (-nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len ==
          -0x1c71c71c71c71c7) {
        slang::detail::throwLengthError();
      }
      uVar12 = nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len +
               1;
      if (nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len + 1 <
          nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len * 2) {
        uVar12 = nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len
                 * 2;
      }
      if (-nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len +
          0x1c71c71c71c71c7 <
          nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len) {
        uVar12 = 0x1c71c71c71c71c7;
      }
      pNVar8 = (pointer)operator_new(uVar12 * 0x48);
      pNVar8[sVar5].name.range.startLoc = SVar13;
      pNVar8[sVar5].name.range.endLoc = SVar4;
      pNVar8[sVar5].name.text._M_len = sVar2;
      pNVar8[sVar5].name.text._M_str = pcVar3;
      pNVar8[sVar5].name.selectors._M_ptr = (pointer)CONCAT44(extraout_var,iVar6);
      pNVar8[sVar5].name.selectors._M_extent._M_extent_value = extraout_RDX;
      pNVar8[sVar5].name.paramAssignments = (ParameterValueAssignmentSyntax *)0x0;
      pNVar8[sVar5].dotLocation = SVar16;
      _Var15._M_extent_value =
           (size_t)(nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.
                    data_ + nameParts.
                            super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.
                            len);
      pNVar11 = pNVar8;
      SVar16 = (SourceLocation)
               nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.data_
      ;
      if ((SourceLocation)_Var15._M_extent_value == SVar17) {
        for (; lVar10 = lVar1, SVar13 = SVar16, pNVar14 = pNVar11, SVar16 != SVar17;
            SVar16 = (SourceLocation)((long)SVar16 + 0x48)) {
          for (; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pNVar14->name).text._M_len = *(size_t *)SVar13;
            SVar13 = (SourceLocation)((long)((long)SVar13 + 8) + (ulong)bVar18 * -0x10);
            pNVar14 = (pointer)((long)pNVar14 + (ulong)bVar18 * -0x10 + 8);
          }
          pNVar11 = pNVar11 + 1;
          ctx = SVar13;
        }
      }
      else {
        for (; lVar10 = lVar1, SVar13 = SVar16, pNVar14 = pNVar11, SVar16 != SVar17;
            SVar16 = (SourceLocation)((long)SVar16 + 0x48)) {
          for (; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pNVar14->name).text._M_len = *(size_t *)SVar13;
            SVar13 = (SourceLocation)((long)((long)SVar13 + 8) + (ulong)bVar18 * -0x10);
            pNVar14 = (pointer)((long)pNVar14 + (ulong)bVar18 * -0x10 + 8);
          }
          pNVar11 = pNVar11 + 1;
          ctx = SVar13;
        }
        pNVar11 = pNVar8 + sVar5;
        for (; pNVar11 = pNVar11 + 1, lVar10 = lVar1, SVar16 = SVar17, pNVar14 = pNVar11,
            SVar17 != (SourceLocation)_Var15._M_extent_value;
            SVar17 = (SourceLocation)((long)SVar17 + 0x48)) {
          for (; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pNVar14->name).text._M_len = *(size_t *)SVar16;
            SVar16 = (SourceLocation)((long)((long)SVar16 + 8) + (ulong)bVar18 * -0x10);
            pNVar14 = (pointer)((long)pNVar14 + (ulong)bVar18 * -0x10 + 8);
          }
          ctx = SVar16;
        }
      }
      SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>::cleanup
                (&nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>,
                 (EVP_PKEY_CTX *)ctx);
      nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.data_ = pNVar8
      ;
      nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.cap = uVar12;
    }
    else {
      *(SourceLocation *)((long)SVar17 + 0x10) = SVar13;
      *(SourceLocation *)((long)SVar17 + 0x18) = SVar4;
      *(size_t *)SVar17 = sVar2;
      *(char **)((long)SVar17 + 8) = pcVar3;
      *(pointer *)((long)SVar17 + 0x20) = (pointer)CONCAT44(extraout_var,iVar6);
      *(size_t *)((long)SVar17 + 0x28) = extraout_RDX;
      *(undefined8 *)((long)SVar17 + 0x30) = 0;
      *(SourceLocation *)((long)SVar17 + 0x38) = SVar16;
    }
    nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len =
         nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len + 1;
    elementSelects.super_SmallVectorBase<const_slang::syntax::ElementSelectSyntax_*>.len = 0;
    pvVar7 = __v;
  } while( true );
}

Assistant:

void Lookup::selectChild(const Type& virtualInterface, SourceRange range,
                         std::span<LookupResult::Selector> selectors, const ASTContext& context,
                         LookupResult& result) {
    NameComponents unused;
    SmallVector<NamePlusLoc, 4> nameParts;
    SmallVector<const ElementSelectSyntax*> elementSelects;
    auto& comp = context.getCompilation();

    for (auto& selector : std::views::reverse(selectors)) {
        if (auto memberSel = std::get_if<LookupResult::MemberSelector>(&selector)) {
            NamePlusLoc npl;
            npl.dotLocation = memberSel->dotLocation;
            npl.name.text = memberSel->name;
            npl.name.range = memberSel->nameRange;
            std::ranges::reverse(elementSelects); // reverse the element selects since we initially
                                                  // saw them in reverse order
            npl.name.selectors = elementSelects.copy(comp);

            nameParts.push_back(npl);
            elementSelects.clear();
        }
        else {
            elementSelects.push_back(std::get<const ElementSelectSyntax*>(selector));
        }
    }

    result.found = getVirtualInterfaceTarget(virtualInterface, context, range);
    lookupDownward(nameParts, unused, context, LookupFlags::None, result);
}